

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_2933843930U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<_18>,_boost::random::detail::M3<_14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<_24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<_1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_2933843930U>
           *this)

{
  type __n;
  type last;
  int local_80;
  result_type local_7c;
  int iterations;
  result_type x;
  uint *p;
  uint local_68 [2];
  uint state [19];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<_18>,_boost::random::detail::M3<_14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<_24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<_1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_2933843930U>
  *this_local;
  
  __n = boost::size<unsigned_int[19]>((uint (*) [19])local_68);
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_68,__n,(int *)((long)&p + 4));
  _iterations = local_68;
  last = boost::range_adl_barrier::end<unsigned_int[19]>((uint (*) [19])local_68);
  boost::random::
  well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<-18>,boost::random::detail::M3<-14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<-24>,boost::random::detail::M3<5>,boost::random::detail::M3<-1>,boost::random::detail::M0,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<_18>,boost::random::detail::M3<_14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<_24>,boost::random::detail::M3<5>,boost::random::detail::M3<_1>,boost::random::detail::M0,boost::random::detail::no_tempering>
              *)this,(uint **)&iterations,last);
  local_80 = 1000000000;
  while (0 < local_80) {
    local_7c = boost::random::
               well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
               ::operator()(&this->rng);
    local_80 = local_80 + -1;
  }
  return local_7c;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }